

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O0

double Cudd_bddCorrelation(DdManager *manager,DdNode *f,DdNode *g)

{
  st__table *table_00;
  double correlation;
  st__table *table;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  table_00 = st__init_table(CorrelCompare,CorrelHash);
  if (table_00 == (st__table *)0x0) {
    manager_local = (DdManager *)0xbff0000000000000;
  }
  else {
    manager_local = (DdManager *)bddCorrelationAux(manager,f,g,table_00);
    st__foreach(table_00,CorrelCleanUp,(char *)0x0);
    st__free_table(table_00);
  }
  return (double)manager_local;
}

Assistant:

double
Cudd_bddCorrelation(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{

    st__table    *table;
    double      correlation;

#ifdef CORREL_STATS
    num_calls = 0;
#endif

    table = st__init_table(CorrelCompare,CorrelHash);
    if (table == NULL) return((double)CUDD_OUT_OF_MEM);
    correlation = bddCorrelationAux(manager,f,g,table);
    st__foreach(table, CorrelCleanUp, NIL(char));
    st__free_table(table);
    return(correlation);

}